

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O2

double expected_sd_cat_internal<unsigned_long,unsigned_long,double>
                 (int ncat,unsigned_long *buffer_cnt,double cnt_l,unsigned_long *buffer_pos,
                 double *buffer_prob)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  uint uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  
  uVar4 = 0;
  for (lVar1 = (long)ncat << 3; lVar1 != 0; lVar1 = lVar1 + -8) {
    buffer_pos[uVar4] = uVar4;
    uVar4 = uVar4 + 1;
  }
  uVar2 = 0;
  uVar3 = (ulong)(uint)ncat;
  if (ncat < 1) {
    uVar3 = uVar2;
  }
  lVar1 = 0;
  uVar5 = 0;
  for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    uVar4 = buffer_cnt[uVar2];
    if (uVar4 == 0) {
      uVar4 = buffer_pos[lVar1];
      buffer_pos[lVar1] = buffer_pos[uVar2];
      buffer_pos[uVar2] = uVar4;
      lVar1 = lVar1 + 1;
    }
    else {
      uVar5 = uVar5 + 1;
      auVar7._8_4_ = (int)(uVar4 >> 0x20);
      auVar7._0_8_ = uVar4;
      auVar7._12_4_ = 0x45300000;
      buffer_prob[uVar2] =
           ((auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0)) / cnt_l;
    }
  }
  if ((int)uVar5 < 2) {
    return 0.0;
  }
  dVar6 = expected_sd_cat<unsigned_long,double>(buffer_prob,(ulong)uVar5,buffer_pos + lVar1);
  return dVar6;
}

Assistant:

double expected_sd_cat_internal(int ncat, number *restrict buffer_cnt, ldouble_safe cnt_l,
                                int_t *restrict buffer_pos, double *restrict buffer_prob)
{
    /* move zero-valued to the beginning */
    std::iota(buffer_pos, buffer_pos + ncat, (int_t)0);
    int_t st_pos = 0;
    int ncat_present = 0;
    int_t temp;
    for (int cat = 0; cat < ncat; cat++)
    {
        if (buffer_cnt[cat])
        {
            ncat_present++;
            buffer_prob[cat] = (ldouble_safe) buffer_cnt[cat] / cnt_l;
        }

        else
        {
            temp = buffer_pos[st_pos];
            buffer_pos[st_pos] = buffer_pos[cat];
            buffer_pos[cat] = temp;
            st_pos++;
        }
    }

    if (ncat_present <= 1) return 0;
    return expected_sd_cat<int_t, ldouble_safe>(buffer_prob, ncat_present, buffer_pos + st_pos);
}